

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cc
# Opt level: O1

void lrit::to_json(json *j,ImageNavigationHeader *h)

{
  value_t t;
  pointer pcVar1;
  json_value jVar2;
  long lVar3;
  initializer_list_t init;
  initializer_list_t init_00;
  initializer_list_t init_01;
  initializer_list_t init_02;
  initializer_list_t init_03;
  initializer_list_t init_04;
  string projectionName;
  undefined1 *local_260;
  undefined8 local_258;
  undefined1 local_250;
  undefined7 uStack_24f;
  undefined8 uStack_248;
  long *local_240 [2];
  long local_230 [2];
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_220;
  value_t local_200 [8];
  undefined8 *local_1f8;
  value_t *local_1f0;
  undefined1 local_1e8;
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_1e0;
  value_t local_1c0 [8];
  long local_1b8;
  value_t *local_1b0;
  undefined1 local_1a8;
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_1a0;
  value_t local_180 [8];
  long local_178;
  value_t *local_170;
  undefined1 local_168;
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_160;
  value_t local_140 [8];
  long local_138;
  value_t *local_130;
  undefined1 local_128;
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_120;
  value_t local_100 [8];
  long local_f8;
  value_t *local_f0;
  undefined1 local_e8;
  undefined1 local_e0 [8];
  json_value local_d8;
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_d0;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_b0;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *local_a0;
  undefined1 local_98;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_90;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *local_80;
  undefined1 local_78;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_70;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *local_60;
  undefined1 local_58;
  undefined1 local_50 [16];
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *local_40;
  undefined1 local_38;
  
  local_240[0] = local_230;
  pcVar1 = (h->projectionName)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_240,pcVar1,pcVar1 + (h->projectionName)._M_string_length);
  std::__cxx11::string::find((char)(string *)local_240,0x29);
  local_220.owned_value.m_value.object = (object_t *)0x0;
  local_220.owned_value.m_type = string;
  local_220.owned_value.m_value.object =
       (object_t *)
       nlohmann::
       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
       ::create<std::__cxx11::string,char_const(&)[15]>((char (*) [15])"ProjectionName");
  local_220.value_ref = &local_220.owned_value;
  local_220.is_rvalue = true;
  std::__cxx11::string::substr((ulong)&local_260,(ulong)local_240);
  local_1f8 = (undefined8 *)0x0;
  local_200[0] = string;
  local_1f8 = (undefined8 *)operator_new(0x20);
  *local_1f8 = local_1f8 + 2;
  if (local_260 == &local_250) {
    local_1f8[2] = CONCAT71(uStack_24f,local_250);
    local_1f8[3] = uStack_248;
  }
  else {
    *local_1f8 = local_260;
    local_1f8[2] = CONCAT71(uStack_24f,local_250);
  }
  local_1f0 = local_200;
  local_1f8[1] = local_258;
  local_258 = 0;
  local_250 = 0;
  local_1e8 = 1;
  init._M_len = 2;
  init._M_array = &local_220;
  local_260 = &local_250;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json(&local_d0.owned_value,init,true,array);
  local_d0.value_ref = &local_d0.owned_value;
  local_d0.is_rvalue = true;
  local_120.owned_value.m_value.object = (object_t *)0x0;
  local_120.owned_value.m_type = string;
  local_120.owned_value.m_value.object =
       (object_t *)
       nlohmann::
       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
       ::create<std::__cxx11::string,char_const(&)[14]>((char (*) [14])"ColumnScaling");
  local_120.value_ref = &local_120.owned_value;
  local_120.is_rvalue = true;
  local_f0 = local_100;
  local_f8 = (long)(int)h->columnScaling;
  local_100[0] = number_integer;
  local_e8 = 1;
  init_00._M_len = 2;
  init_00._M_array = (iterator)local_120.value_ref;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json(&local_b0,init_00,true,array);
  local_98 = 1;
  local_160.owned_value.m_value.object = (object_t *)0x0;
  local_160.owned_value.m_type = string;
  local_a0 = &local_b0;
  local_160.owned_value.m_value.object =
       (object_t *)
       nlohmann::
       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
       ::create<std::__cxx11::string,char_const(&)[12]>((char (*) [12])"LineScaling");
  local_160.value_ref = &local_160.owned_value;
  local_160.is_rvalue = true;
  local_130 = local_140;
  local_138 = (long)(int)h->lineScaling;
  local_140[0] = number_integer;
  local_128 = 1;
  init_01._M_len = 2;
  init_01._M_array = (iterator)local_160.value_ref;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json(&local_90,init_01,true,array);
  local_78 = 1;
  local_1a0.owned_value.m_value.object = (object_t *)0x0;
  local_1a0.owned_value.m_type = string;
  local_80 = &local_90;
  local_1a0.owned_value.m_value.object =
       (object_t *)
       nlohmann::
       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
       ::create<std::__cxx11::string,char_const(&)[13]>((char (*) [13])"ColumnOffset");
  local_1a0.value_ref = &local_1a0.owned_value;
  local_1a0.is_rvalue = true;
  local_170 = local_180;
  local_178 = (long)(int)h->columnOffset;
  local_180[0] = number_integer;
  local_168 = 1;
  init_02._M_len = 2;
  init_02._M_array = (iterator)local_1a0.value_ref;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json(&local_70,init_02,true,array);
  local_58 = 1;
  local_1e0.owned_value.m_value.object = (object_t *)0x0;
  local_1e0.owned_value.m_type = string;
  local_60 = &local_70;
  local_1e0.owned_value.m_value.object =
       (object_t *)
       nlohmann::
       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
       ::create<std::__cxx11::string,char_const(&)[11]>((char (*) [11])"LineOffset");
  local_1e0.value_ref = &local_1e0.owned_value;
  local_1e0.is_rvalue = true;
  local_1b0 = local_1c0;
  local_1b8 = (long)(int)h->lineOffset;
  local_1c0[0] = number_integer;
  local_1a8 = 1;
  init_03._M_len = 2;
  init_03._M_array = (iterator)local_1e0.value_ref;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)local_50,init_03,true,array);
  local_38 = 1;
  init_04._M_len = 5;
  init_04._M_array = &local_d0;
  local_40 = (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              *)local_50;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)local_e0,init_04,true,array);
  t = j->m_type;
  j->m_type = local_e0[0];
  jVar2 = j->m_value;
  j->m_value = local_d8;
  local_e0[0] = t;
  local_d8 = jVar2;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::json_value::destroy((json_value *)(local_e0 + 8),t);
  lVar3 = 0;
  do {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::json_value::destroy((json_value *)(local_50 + lVar3 + 8),local_50[lVar3]);
    lVar3 = lVar3 + -0x20;
  } while (lVar3 != -0xa0);
  lVar3 = 0;
  do {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::json_value::destroy((json_value *)((long)&local_1b8 + lVar3),local_1c0[lVar3]);
    lVar3 = lVar3 + -0x20;
  } while (lVar3 != -0x40);
  lVar3 = 0;
  do {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::json_value::destroy((json_value *)((long)&local_178 + lVar3),local_180[lVar3]);
    lVar3 = lVar3 + -0x20;
  } while (lVar3 != -0x40);
  lVar3 = 0;
  do {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::json_value::destroy((json_value *)((long)&local_138 + lVar3),local_140[lVar3]);
    lVar3 = lVar3 + -0x20;
  } while (lVar3 != -0x40);
  lVar3 = 0;
  do {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::json_value::destroy((json_value *)((long)&local_f8 + lVar3),local_100[lVar3]);
    lVar3 = lVar3 + -0x20;
  } while (lVar3 != -0x40);
  lVar3 = 0;
  do {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::json_value::destroy((json_value *)((long)&local_1f8 + lVar3),local_200[lVar3]);
    lVar3 = lVar3 + -0x20;
  } while (lVar3 != -0x40);
  if (local_260 != &local_250) {
    operator_delete(local_260,CONCAT71(uStack_24f,local_250) + 1);
  }
  if (local_240[0] != local_230) {
    operator_delete(local_240[0],local_230[0] + 1);
  }
  return;
}

Assistant:

void to_json(json& j, const ImageNavigationHeader& h) {
  std::string projectionName(h.projectionName);
  auto rpos = projectionName.find(')');
  j = {
      {"ProjectionName", projectionName.substr(0, rpos + 1)},
      {"ColumnScaling", int(h.columnScaling)},
      {"LineScaling", int(h.lineScaling)},
      {"ColumnOffset", int(h.columnOffset)},
      {"LineOffset", int(h.lineOffset)},
  };
}